

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O2

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::get_options
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this)

{
  Display DVar1;
  pointer *__ptr;
  long in_RSI;
  Source local_28;
  undefined4 local_1c;
  
  local_1c = 1;
  std::make_unique<Sinclair::ZXSpectrum::Machine::Options,Configurable::OptionsType>
            ((OptionsType *)&local_28);
  *(undefined1 *)((long)local_28._vptr_Source + 0xd) = *(undefined1 *)(in_RSI + 0x359f9);
  *(undefined1 *)((long)local_28._vptr_Source + 0xc) = *(undefined1 *)(in_RSI + 0x35a0c);
  DVar1 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0xe8))
  ;
  *(Display *)(local_28._vptr_Source + 1) = DVar1;
  (this->super_Source)._vptr_Source = local_28._vptr_Source;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() override {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);	// OptionsType is arbitrary, but not optional.
			options->automatic_tape_motor_control = use_automatic_tape_motor_control_;
			options->quickload = allow_fast_tape_hack_;
			options->output = get_video_signal_configurable();
			return options;
		}